

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O1

void __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<false>_>::assign_operators
          (fm_engine_base<ymfm::opn_registers_base<false>_> *this)

{
  uint uVar1;
  _Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<false>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<false>_>_>_>
  _Var2;
  uint32_t chnum;
  long lVar3;
  long lVar4;
  uint uVar5;
  _Head_base<0UL,_ymfm::fm_operator<ymfm::opn_registers_base<false>_>_*,_false> _Var6;
  operator_mapping map;
  operator_mapping local_14;
  
  opn_registers_base<false>::operator_map((opn_registers_base<false> *)this,&local_14);
  lVar3 = 0;
  do {
    uVar1 = local_14.chan[lVar3];
    lVar4 = 0;
    do {
      uVar5 = uVar1 >> ((byte)lVar4 & 0x1f) & 0xff;
      if (uVar5 == 0xff) {
        _Var6._M_head_impl = (fm_operator<ymfm::opn_registers_base<false>_> *)0x0;
      }
      else {
        _Var6._M_head_impl =
             this->m_operator[uVar5]._M_t.
             super___uniq_ptr_impl<ymfm::fm_operator<ymfm::opn_registers_base<false>_>,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<false>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ymfm::fm_operator<ymfm::opn_registers_base<false>_>_*,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<false>_>_>_>
             .super__Head_base<0UL,_ymfm::fm_operator<ymfm::opn_registers_base<false>_>_*,_false>.
             _M_head_impl;
      }
      _Var2.super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<false>_>_*,_false>.
      _M_head_impl = this->m_channel[lVar3]._M_t.
                     super___uniq_ptr_impl<ymfm::fm_channel<ymfm::opn_registers_base<false>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<false>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<false>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<false>_>_>_>
                     .
                     super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<false>_>_*,_false>
      ;
      *(fm_operator<ymfm::opn_registers_base<false>_> **)
       ((long)_Var2.
              super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<false>_>_*,_false>.
              _M_head_impl + lVar4 + 0x10) = _Var6._M_head_impl;
      if (_Var6._M_head_impl != (fm_operator<ymfm::opn_registers_base<false>_> *)0x0) {
        (_Var6._M_head_impl)->m_choffs =
             *(undefined4 *)
              _Var2.
              super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<false>_>_*,_false>.
              _M_head_impl;
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x20);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

void fm_engine_base<RegisterType>::assign_operators()
{
	typename RegisterType::operator_mapping map;
	m_regs.operator_map(map);

	for (uint32_t chnum = 0; chnum < CHANNELS; chnum++)
		for (uint32_t index = 0; index < 4; index++)
		{
			uint32_t opnum = bitfield(map.chan[chnum], 8 * index, 8);
			m_channel[chnum]->assign(index, (opnum == 0xff) ? nullptr : m_operator[opnum].get());
		}
}